

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_warningUnrequiredCircularDependencyUnits_Test::TestBody
          (Importer_warningUnrequiredCircularDependencyUnits_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  element_type *peVar4;
  AssertHelper local_188 [8];
  Message local_180 [8];
  unsigned_long local_178 [2];
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_138 [8];
  Message local_130 [15];
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  string local_108 [32];
  string local_e8 [32];
  AssertHelper local_c8 [8];
  Message local_c0 [8];
  unsigned_long local_b8 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  undefined1 local_40 [8];
  ModelPtr model;
  ImporterPtr importer;
  ParserPtr parser;
  Importer_warningUnrequiredCircularDependencyUnits_Test *this_local;
  
  this_00 = &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  libcellml::Importer::create((bool)((char)&model + '\b'));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"importer/master2.cellml",&local_81);
  fileContents(local_60);
  libcellml::Parser::parseModel((string *)local_40);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  local_b8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_b8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_a8,"size_t(0)","parser->issueCount()",local_b8 + 1,local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=(local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  peVar4 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"importer/",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  resourcePath(local_e8);
  libcellml::Importer::resolveImports((shared_ptr *)peVar4,(string *)local_40);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_40);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_121 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_120,"model->hasUnresolvedImports()",
               "true");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(local_138,local_130);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_178[1] = 0;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_178[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_168,"size_t(0)","importer->issueCount()",local_178 + 1,
             local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=(local_188,local_180);
    testing::internal::AssertHelper::~AssertHelper(local_188);
    testing::Message::~Message(local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_40);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Importer, warningUnrequiredCircularDependencyUnits)
{
    auto parser = libcellml::Parser::create();
    auto importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("importer/master2.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    // Expect no issues as the circular dependency is not instantiated.
    EXPECT_EQ(size_t(0), importer->issueCount());
}